

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

nn_cmsghdr * nn_cmsg_nxthdr_(nn_msghdr *mhdr,nn_cmsghdr *cmsg)

{
  long *in_RSI;
  long in_RDI;
  size_t headsz;
  nn_cmsghdr *next;
  size_t sz;
  char *data;
  nn_cmsghdr *local_30;
  ulong local_28;
  nn_cmsghdr *local_20;
  nn_cmsghdr *local_8;
  
  if (in_RDI == 0) {
    local_8 = (nn_cmsghdr *)0x0;
  }
  else {
    if (*(long *)(in_RDI + 0x18) == -1) {
      local_20 = (nn_cmsghdr *)**(undefined8 **)(in_RDI + 0x10);
      local_28 = nn_chunk_size((void *)0x132ed9);
    }
    else {
      local_20 = *(nn_cmsghdr **)(in_RDI + 0x10);
      local_28 = *(ulong *)(in_RDI + 0x18);
    }
    if (local_28 < 0x10) {
      local_8 = (nn_cmsghdr *)0x0;
    }
    else {
      if (in_RSI == (long *)0x0) {
        local_30 = local_20;
      }
      else {
        local_30 = (nn_cmsghdr *)((long)in_RSI + (*in_RSI + 7U & 0xfffffffffffffff8));
      }
      if ((local_28 < (ulong)((long)local_30 + (0x10 - (long)local_20))) ||
         (local_28 <
          (long)local_30 + ((local_30->cmsg_len + 7 & 0xfffffffffffffff8) - (long)local_20))) {
        local_8 = (nn_cmsghdr *)0x0;
      }
      else {
        local_8 = local_30;
      }
    }
  }
  return local_8;
}

Assistant:

struct nn_cmsghdr *nn_cmsg_nxthdr_ (const struct nn_msghdr *mhdr,
    const struct nn_cmsghdr *cmsg)
{
    char *data;
    size_t sz;
    struct nn_cmsghdr *next;
    size_t headsz;

    /*  Early return if no message is provided. */
    if (nn_slow (mhdr == NULL))
        return NULL;

    /*  Get the actual data. */
    if (mhdr->msg_controllen == NN_MSG) {
        data = *((void**) mhdr->msg_control);
        sz = nn_chunk_size (data);
    }
    else {
        data = (char*) mhdr->msg_control;
        sz = mhdr->msg_controllen;
    }

    /*  Ancillary data allocation was not even large enough for one element. */
    if (nn_slow (sz < NN_CMSG_SPACE (0)))
        return NULL;

    /*  If cmsg is set to NULL we are going to return first property.
        Otherwise move to the next property. */
    if (!cmsg)
        next = (struct nn_cmsghdr*) data;
    else
        next = (struct nn_cmsghdr*)
            (((char*) cmsg) + NN_CMSG_ALIGN_ (cmsg->cmsg_len));

    /*  If there's no space for next property, treat it as the end
        of the property list. */
    headsz = ((char*) next) - data;
    if (headsz + NN_CMSG_SPACE (0) > sz ||
          headsz + NN_CMSG_ALIGN_ (next->cmsg_len) > sz)
        return NULL;
    
    /*  Success. */
    return next;
}